

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O2

void __thiscall hdc::PrettyPrinter::visit(PrettyPrinter *this,LogicalOrExpression *expression)

{
  TokenKind TVar1;
  Expression *pEVar2;
  char *pcVar3;
  undefined1 local_50 [48];
  
  pEVar2 = BinaryOperator::getLeft(&expression->super_BinaryOperator);
  (**(pEVar2->super_Statement).super_ASTNode._vptr_ASTNode)(pEVar2,this);
  BinaryOperator::getOper((Token *)local_50,&expression->super_BinaryOperator);
  TVar1 = Token::getKind((Token *)local_50);
  std::__cxx11::string::~string((string *)(local_50 + 0x10));
  pcVar3 = " || ";
  if (TVar1 == TK_OR) {
    pcVar3 = " or ";
  }
  std::operator<<((ostream *)&this->field_0x20,pcVar3);
  pEVar2 = BinaryOperator::getRight(&expression->super_BinaryOperator);
  (**(pEVar2->super_Statement).super_ASTNode._vptr_ASTNode)(pEVar2,this);
  return;
}

Assistant:

void PrettyPrinter::visit(LogicalOrExpression *expression) {
    expression->getLeft()->accept(this);

    if (expression->getOper().getKind() == TK_OR) {
        output << " or ";
    } else {
        output << " || ";
    }

    expression->getRight()->accept(this);
}